

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::LookupParameters::scale_parameters(LookupParameters *this,float a)

{
  bool bVar1;
  iterator this_00;
  iterator this_01;
  Tensor *p;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
  *in_stack_ffffffffffffffb0;
  
  this_00 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::begin(in_stack_ffffffffffffffa8)
  ;
  this_01 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>::
    operator*((__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
               *)&stack0xffffffffffffffe0);
    Tensor::operator*(this_01._M_current);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)this_00._M_current,(Scalar *)this_01._M_current);
    __gnu_cxx::
    __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>::
    operator++((__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void LookupParameters::scale_parameters(float a) {
  for (auto& p : values)
    (*p) *= a;
}